

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

char * getSelectionString(Atom selection)

{
  int iVar1;
  Window WVar2;
  char *pcVar3;
  Atom in_RDI;
  char *string;
  size_t size;
  XEvent dummy;
  XEvent notification;
  unsigned_long bytesAfter;
  unsigned_long itemCount;
  int actualFormat;
  Atom actualType;
  char *data;
  size_t targetCount;
  Atom targets [2];
  char **selectionString;
  size_t i;
  Atom *source;
  long *plVar4;
  char *local_208;
  size_t local_200;
  undefined1 local_1f8 [176];
  double *in_stack_fffffffffffffeb8;
  undefined1 local_138 [32];
  undefined8 local_118;
  long local_100;
  undefined1 local_78 [8];
  long local_70;
  undefined1 local_64 [4];
  Atom local_60;
  char *local_58;
  undefined8 local_50;
  Atom local_48 [3];
  char **local_30;
  ulong local_28;
  Atom local_20;
  char *local_18;
  
  local_48[0] = _glfw.x11.UTF8_STRING;
  local_48[1] = 0x1f;
  local_50 = 2;
  if (in_RDI == _glfw.x11.PRIMARY) {
    local_30 = &_glfw.x11.primarySelectionString;
  }
  else {
    local_30 = &_glfw.x11.clipboardString;
  }
  local_20 = in_RDI;
  WVar2 = XGetSelectionOwner(_glfw.x11.display,in_RDI);
  if (WVar2 == _glfw.x11.helperWindowHandle) {
    local_18 = *local_30;
  }
  else {
    free(*local_30);
    *local_30 = (char *)0x0;
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      XConvertSelection(_glfw.x11.display,local_20,local_48[local_28],_glfw.x11.GLFW_SELECTION,
                        _glfw.x11.helperWindowHandle,0);
      while (iVar1 = XCheckTypedWindowEvent
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,local_138),
            iVar1 == 0) {
        waitForEvent(in_stack_fffffffffffffeb8);
      }
      if (local_100 != 0) {
        XCheckIfEvent(_glfw.x11.display,local_1f8,isSelPropNewValueNotify,local_138);
        source = &local_60;
        plVar4 = &local_70;
        XGetWindowProperty(_glfw.x11.display,local_118,local_100,0,0x7fffffffffffffff,1,0,source,
                           local_64,plVar4,local_78,&local_58);
        if (local_60 == _glfw.x11.INCR) {
          local_200 = 1;
          local_208 = (char *)0x0;
          do {
            while (iVar1 = XCheckIfEvent(_glfw.x11.display,local_1f8,isSelPropNewValueNotify,
                                         local_138), iVar1 == 0) {
              waitForEvent(in_stack_fffffffffffffeb8);
            }
            XFree(local_58);
            plVar4 = &local_70;
            XGetWindowProperty(_glfw.x11.display,local_118,local_100,0,0x7fffffffffffffff,1,0,
                               &local_60,local_64,plVar4,local_78,&local_58);
            if (local_70 != 0) {
              local_200 = local_70 + local_200;
              local_208 = (char *)realloc(local_208,local_200);
              local_208[(local_200 - local_70) + -1] = '\0';
              strcat(local_208,local_58);
            }
          } while (local_70 != 0);
          if (local_48[local_28] == 0x1f) {
            pcVar3 = convertLatin1toUTF8((char *)plVar4);
            *local_30 = pcVar3;
            free(local_208);
          }
          else {
            *local_30 = local_208;
          }
        }
        else if (local_60 == local_48[local_28]) {
          if (local_48[local_28] == 0x1f) {
            pcVar3 = convertLatin1toUTF8((char *)plVar4);
            *local_30 = pcVar3;
          }
          else {
            pcVar3 = _glfw_strdup((char *)source);
            *local_30 = pcVar3;
          }
        }
        XFree(local_58);
        if (*local_30 != (char *)0x0) break;
      }
    }
    if (*local_30 == (char *)0x0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
    }
    local_18 = *local_30;
  }
  return local_18;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    size_t i;
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}